

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurCharReader::parse(OurCharReader *this,char *beginDoc,char *endDoc,Value *root,string *errs)

{
  string *in_R8;
  bool ok;
  char *in_stack_00000058;
  char *in_stack_00000060;
  OurReader *in_stack_00000068;
  OurReader *in_stack_00000118;
  string local_50 [39];
  byte local_29;
  string *local_28;
  
  local_28 = in_R8;
  local_29 = OurReader::parse(in_stack_00000068,in_stack_00000060,in_stack_00000058,(Value *)this,
                              beginDoc._7_1_);
  if (local_28 != (string *)0x0) {
    OurReader::getFormattedErrorMessages_abi_cxx11_(in_stack_00000118);
    std::__cxx11::string::operator=(local_28,local_50);
    std::__cxx11::string::~string(local_50);
  }
  return (bool)(local_29 & 1);
}

Assistant:

virtual bool parse(
      char const* beginDoc, char const* endDoc,
      Value* root, std::string* errs) {
    bool ok = reader_.parse(beginDoc, endDoc, *root, collectComments_);
    if (errs) {
      *errs = reader_.getFormattedErrorMessages();
    }
    return ok;
  }